

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# degree.cpp
# Opt level: O2

void degree(void)

{
  pointer *ppiVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> degree;
  allocator_type local_41;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_40;
  
  freopen("degree.txt","w",_stdout);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_40,(long)V
             ,&local_41);
  ppiVar1 = &((edge.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
  for (lVar4 = 0; lVar4 < V; lVar4 = lVar4 + 1) {
    local_40._M_impl.super__Vector_impl_data._M_start[lVar4].first =
         (int)((ulong)((long)*ppiVar1 - (long)((_Vector_impl_data *)(ppiVar1 + -1))->_M_start) >> 2)
    ;
    local_40._M_impl.super__Vector_impl_data._M_start[lVar4].second = (int)lVar4;
    ppiVar1 = ppiVar1 + 3;
  }
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_40._M_impl.super__Vector_impl_data._M_start,
             local_40._M_impl.super__Vector_impl_data._M_finish);
  uVar5 = (ulong)(uint)V;
  lVar4 = uVar5 * 8 + -4;
  for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
    pmVar2 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,
                          (key_type *)
                          ((long)&(local_40._M_impl.super__Vector_impl_data._M_start)->first + lVar4
                          ));
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,local_40._M_impl.super__Vector_impl_data._M_start[uVar5 - 1].first);
    lVar4 = lVar4 + -8;
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_40);
  return;
}

Assistant:

void degree() {
    freopen("degree.txt", "w", stdout); // output file

    vector< pair<int,int> > degree(V);
    for (int i = 0; i < V; i++) {
        degree[i] = make_pair(edge[i].size(), i);
    }

    stable_sort(degree.begin(), degree.end());

    for (int i = V-1; i >= 0; i--) {
        cout << name[degree[i].second] << ": " << degree[i].first << endl;
    }
}